

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O1

void do_springy_proc(Am_Object param_1)

{
  Am_Value *pAVar1;
  bool bVar2;
  char cVar3;
  Am_Object *this;
  Am_Object beam;
  Am_Value_List beams;
  Am_Object local_50;
  Am_Value_List local_48 [16];
  Am_Object local_38;
  Am_Object local_30;
  
  pAVar1 = (Am_Value *)Am_Object::Get(0xe450,(ulong)IS_SPRINGY);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar1);
  Am_Object::Set(0xe450,SUB21(IS_SPRINGY,0),(ulong)!bVar2);
  Am_Value_List::Am_Value_List(local_48);
  local_50.data = (Am_Object_Data *)0x0;
  pAVar1 = (Am_Value *)Am_Object::Get(0xe3f8,0x82);
  Am_Value_List::operator=(local_48,pAVar1);
  Am_Value_List::Start();
  while( true ) {
    cVar3 = Am_Value_List::Last();
    if (cVar3 != '\0') break;
    pAVar1 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&local_50,pAVar1);
    if (bVar2) {
      Am_Object::Am_Object(&local_38,&local_50);
      this = &local_38;
    }
    else {
      Am_Object::Am_Object(&local_30,&local_50);
      this = &local_30;
    }
    Am_Object::~Am_Object(this);
    Am_Value_List::Next();
  }
  Am_Object::~Am_Object(&local_50);
  Am_Value_List::~Am_Value_List(local_48);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_springy, (Am_Object))
{
  bool is_springy = SP_Springy_Command.Get(IS_SPRINGY);
  is_springy = !is_springy;
  SP_Springy_Command.Set(IS_SPRINGY, is_springy);

  Am_Value_List beams;
  Am_Object beam;
  beams = SP_Beam_Agg.Get(Am_GRAPHICAL_PARTS);
  for (beams.Start(); !beams.Last(); beams.Next()) {
    beam = beams.Get();
    if (is_springy)
      make_beam_springy(beam);
    else
      make_beam_rigid(beam);
  }
}